

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_impl.h
# Opt level: O3

void secp256k1_fe_inv_var(secp256k1_fe *r,secp256k1_fe *x)

{
  uint64_t uVar1;
  long lVar2;
  undefined1 auVar3 [16];
  int iVar4;
  secp256k1_gej *psVar5;
  byte bVar6;
  bool bVar7;
  uint uVar8;
  ulong uVar9;
  secp256k1_gej *psVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  secp256k1_modinv64_modinfo *extraout_RDX;
  secp256k1_modinv64_modinfo *extraout_RDX_00;
  secp256k1_modinv64_modinfo *extraout_RDX_01;
  secp256k1_modinv64_modinfo *modinfo;
  secp256k1_gej *extraout_RDX_02;
  long lVar15;
  long lVar16;
  code *extraout_RDX_03;
  secp256k1_gej *psVar17;
  secp256k1_modinv64_modinfo *unaff_RBP;
  secp256k1_gej *psVar18;
  ulong uVar19;
  secp256k1_gej *ng;
  secp256k1_gej *r_00;
  secp256k1_gej *psVar20;
  uint64_t *puVar21;
  long lVar22;
  secp256k1_gej *psVar23;
  undefined1 *puVar24;
  secp256k1_gej *psVar25;
  secp256k1_gej *psVar26;
  secp256k1_gej *psVar27;
  secp256k1_gej *psVar28;
  secp256k1_gej *psVar29;
  secp256k1_modinv64_signed62 f;
  secp256k1_modinv64_signed62 g;
  secp256k1_modinv64_signed62 d;
  secp256k1_fe tmp;
  secp256k1_scalar sStack_a64;
  secp256k1_strauss_state sStack_a60;
  secp256k1_gej sStack_a48;
  secp256k1_gej sStack_9b0;
  secp256k1_fe asStack_918 [4];
  secp256k1_ge sStack_850;
  secp256k1_ge asStack_7e8 [4];
  secp256k1_strauss_point_state sStack_648;
  secp256k1_gej *psStack_230;
  secp256k1_gej *psStack_228;
  secp256k1_gej *psStack_220;
  secp256k1_gej *psStack_218;
  secp256k1_gej *psStack_210;
  secp256k1_gej *psStack_208;
  int iStack_1fc;
  secp256k1_gej *psStack_1f8;
  uint64_t uStack_1f0;
  uint64_t uStack_1e8;
  uint64_t uStack_1e0;
  secp256k1_gej *psStack_1d8;
  secp256k1_gej *psStack_1d0;
  secp256k1_gej *psStack_1c8;
  secp256k1_gej *psStack_1c0;
  secp256k1_gej *psStack_1b8;
  secp256k1_gej *psStack_1b0;
  uint local_19c;
  secp256k1_gej *local_198;
  secp256k1_fe *local_190;
  long local_188;
  ulong local_180;
  ulong local_178;
  secp256k1_gej *local_170;
  undefined1 local_168 [56];
  uint64_t uStack_130;
  uint64_t local_128;
  uint64_t uStack_120;
  ulong local_118 [2];
  undefined1 local_108 [56];
  secp256k1_gej *local_d0;
  secp256k1_gej *local_c8;
  secp256k1_gej *local_c0;
  secp256k1_modinv64_signed62 local_b8;
  secp256k1_modinv64_signed62 local_90;
  uint64_t local_68;
  uint64_t uStack_60;
  uint64_t local_58;
  uint64_t uStack_50;
  uint64_t local_48;
  uint64_t uStack_40;
  
  psVar28 = (secp256k1_gej *)0xf000000000000;
  psStack_1b0 = (secp256k1_gej *)0x11e134;
  local_170 = (secp256k1_gej *)r;
  secp256k1_fe_verify(x);
  local_188 = 0x1000003d1;
  uVar9 = (x->n[4] >> 0x30) * 0x1000003d1 + x->n[0];
  uVar19 = (uVar9 >> 0x34) + x->n[1];
  uVar12 = (uVar19 >> 0x34) + x->n[2];
  uVar13 = (uVar12 >> 0x34) + x->n[3];
  uVar14 = (uVar13 >> 0x34) + (x->n[4] & 0xffffffffffff);
  local_178 = (uVar19 | uVar9 | uVar12 | uVar13) & 0xfffffffffffff | uVar14;
  local_180 = (uVar9 ^ 0x1000003d0) & uVar19 & uVar12 & uVar13 & (uVar14 ^ 0xf000000000000);
  psStack_1b0 = (secp256k1_gej *)0x11e1ae;
  secp256k1_fe_verify(x);
  local_68 = x->n[0];
  uStack_60 = x->n[1];
  local_58 = x->n[2];
  uStack_50 = x->n[3];
  local_48 = x->n[4];
  uStack_40._0_4_ = x->magnitude;
  uStack_40._4_4_ = x->normalized;
  psVar17 = (secp256k1_gej *)&stack0xffffffffffffff98;
  psStack_1b0 = (secp256k1_gej *)0x11e1dd;
  local_190 = x;
  secp256k1_fe_normalize_var((secp256k1_fe *)psVar17);
  local_168._0_8_ = (uStack_60 << 0x34 | local_68) & 0x3fffffffffffffff;
  local_168._8_8_ = (ulong)((uint)local_58 & 0xfffff) << 0x2a | uStack_60 >> 10;
  local_168._16_8_ = (ulong)((uint)uStack_50 & 0x3fffffff) << 0x20 | local_58 >> 0x14;
  local_168._24_8_ = (local_48 & 0xffffffffff) << 0x16 | uStack_50 >> 0x1e;
  local_168._32_8_ = local_48 >> 0x28;
  local_b8.v[2] = 0;
  local_b8.v[3] = 0;
  local_b8.v[0] = 0;
  local_b8.v[1] = 0;
  local_b8.v[4] = 0;
  local_90.v[3] = 0;
  local_90.v[4] = 0;
  local_90.v[1] = 0;
  local_90.v[2] = 0;
  local_90.v[0] = 1;
  local_128 = 0;
  uStack_120 = 0;
  local_168._48_8_ = -0x1000003d1;
  uStack_130 = 0;
  local_118[0] = 0x100;
  local_198 = (secp256k1_gej *)0x0;
  psVar27 = (secp256k1_gej *)0xffffffffffffffff;
  local_19c = 5;
  local_108._0_8_ = local_168._0_8_;
  local_108._8_8_ = local_168._8_8_;
  local_108._16_8_ = local_168._16_8_;
  local_108._24_8_ = local_168._24_8_;
  local_108._32_8_ = local_168._32_8_;
LAB_0011e2f3:
  psVar18 = (secp256k1_gej *)local_168._48_8_;
  psVar5 = (secp256k1_gej *)0x0;
  psVar23 = (secp256k1_gej *)0x0;
  psVar20 = (secp256k1_gej *)0x1;
  uVar11 = 0x3e;
  ng = (secp256k1_gej *)0x1;
  puVar24 = (undefined1 *)local_108._0_8_;
  psVar26 = (secp256k1_gej *)local_168._48_8_;
  while( true ) {
    r_00 = (secp256k1_gej *)(-1L << ((byte)uVar11 & 0x3f) | (ulong)puVar24);
    psVar10 = (secp256k1_gej *)0x0;
    if (r_00 != (secp256k1_gej *)0x0) {
      for (; ((ulong)r_00 >> (long)psVar10 & 1) == 0;
          psVar10 = (secp256k1_gej *)((long)(psVar10->x).n + 1)) {
      }
    }
    bVar6 = (byte)psVar10;
    psVar25 = (secp256k1_gej *)((ulong)puVar24 >> (bVar6 & 0x3f));
    ng = (secp256k1_gej *)((long)ng << (bVar6 & 0x3f));
    psVar5 = (secp256k1_gej *)((long)psVar5 << (bVar6 & 0x3f));
    psVar27 = (secp256k1_gej *)((long)psVar27 - (long)psVar10);
    uVar11 = uVar11 - (int)psVar10;
    if (uVar11 == 0) break;
    if (((ulong)psVar26 & 1) == 0) {
      psStack_1b0 = (secp256k1_gej *)0x11e867;
      secp256k1_fe_inv_var_cold_8();
LAB_0011e867:
      psStack_1b0 = (secp256k1_gej *)0x11e86c;
      secp256k1_fe_inv_var_cold_7();
LAB_0011e86c:
      psStack_1b0 = (secp256k1_gej *)0x11e871;
      secp256k1_fe_inv_var_cold_1();
LAB_0011e871:
      psStack_1b0 = (secp256k1_gej *)0x11e876;
      secp256k1_fe_inv_var_cold_2();
LAB_0011e876:
      psStack_1b0 = (secp256k1_gej *)0x11e87b;
      secp256k1_fe_inv_var_cold_6();
      psVar25 = psVar26;
      goto LAB_0011e87b;
    }
    if (((ulong)psVar25 & 1) == 0) goto LAB_0011e867;
    r_00 = (secp256k1_gej *)((long)psVar5 * local_108._0_8_ + (long)ng * local_168._48_8_);
    psVar10 = (secp256k1_gej *)(ulong)(0x3e - uVar11);
    bVar6 = (byte)(0x3e - uVar11);
    psVar17 = (secp256k1_gej *)((long)psVar26 << (bVar6 & 0x3f));
    if (r_00 != psVar17) goto LAB_0011e86c;
    psVar17 = (secp256k1_gej *)((long)psVar20 * local_108._0_8_ + (long)psVar23 * local_168._48_8_);
    r_00 = (secp256k1_gej *)((long)psVar25 << (bVar6 & 0x3f));
    if (psVar17 != r_00) goto LAB_0011e871;
    psVar10 = (secp256k1_gej *)((long)psVar27[-5].x.n + 0xe);
    if (psVar10 < (secp256k1_gej *)0xfffffffffffffa2d) goto LAB_0011e876;
    iVar4 = (int)psVar25;
    if ((long)psVar27 < 0) {
      psVar27 = (secp256k1_gej *)-(long)psVar27;
      uVar8 = (int)psVar27 + 1;
      if ((int)uVar11 <= (int)uVar8) {
        uVar8 = uVar11;
      }
      psVar10 = (secp256k1_gej *)(ulong)uVar8;
      r_00 = (secp256k1_gej *)(ulong)(uVar8 - 0x3f);
      if (0xffffffc1 < uVar8 - 0x3f) {
        psVar29 = (secp256k1_gej *)-(long)psVar5;
        unaff_RBP = (secp256k1_modinv64_modinfo *)-(long)ng;
        psVar10 = (secp256k1_gej *)-(long)psVar26;
        psVar17 = (secp256k1_gej *)
                  ((ulong)(0x3fL << (-(char)uVar8 & 0x3fU)) >> (-(char)uVar8 & 0x3fU));
        uVar8 = (iVar4 * iVar4 + 0x3e) * iVar4 * (int)psVar10 & (uint)psVar17;
        psVar5 = psVar20;
        ng = psVar23;
        psVar28 = psVar29;
        goto LAB_0011e44d;
      }
      goto LAB_0011e885;
    }
    uVar8 = (int)psVar27 + 1;
    if ((int)uVar11 <= (int)uVar8) {
      uVar8 = uVar11;
    }
    psVar10 = (secp256k1_gej *)(ulong)uVar8;
    r_00 = (secp256k1_gej *)(ulong)(uVar8 - 0x3f);
    if (uVar8 - 0x3f < 0xffffffc2) goto LAB_0011e880;
    psVar17 = (secp256k1_gej *)((ulong)(0xfL << (-(char)uVar8 & 0x3fU)) >> (-(char)uVar8 & 0x3fU));
    uVar8 = -(iVar4 * (((int)psVar26 * 2 + 2U & 8) + (int)psVar26)) & (uint)psVar17;
    unaff_RBP = (secp256k1_modinv64_modinfo *)psVar23;
    psVar29 = psVar20;
    psVar10 = psVar25;
    psVar25 = psVar26;
LAB_0011e44d:
    uVar9 = (ulong)uVar8;
    r_00 = (secp256k1_gej *)(uVar9 * (long)psVar25);
    puVar24 = (undefined1 *)((long)(psVar10->x).n + (long)(r_00->x).n);
    psVar23 = (secp256k1_gej *)((long)(((secp256k1_gej *)unaff_RBP)->x).n + (long)ng * uVar9);
    psVar10 = (secp256k1_gej *)(uVar9 * (long)psVar5);
    psVar20 = (secp256k1_gej *)((long)(psVar29->x).n + (long)(psVar10->x).n);
    psVar26 = psVar25;
    if (((ulong)puVar24 & (ulong)psVar17) != 0) {
LAB_0011e87b:
      psStack_1b0 = (secp256k1_gej *)0x11e880;
      secp256k1_fe_inv_var_cold_4();
      psVar26 = psVar25;
LAB_0011e880:
      psStack_1b0 = (secp256k1_gej *)0x11e885;
      secp256k1_fe_inv_var_cold_3();
LAB_0011e885:
      psStack_1b0 = (secp256k1_gej *)0x11e88a;
      secp256k1_fe_inv_var_cold_5();
      goto LAB_0011e88a;
    }
  }
  r_00 = (secp256k1_gej *)((long)psVar5 * (long)psVar23);
  psVar10 = SUB168(SEXT816((long)psVar5) * SEXT816((long)psVar23),8);
  psStack_1d0 = (secp256k1_gej *)local_168._48_8_;
  local_108._48_8_ = ng;
  local_d0 = psVar5;
  local_c8 = psVar23;
  local_c0 = psVar20;
  if ((long)ng * (long)psVar20 - (long)r_00 != 0x4000000000000000 ||
      SUB168(SEXT816((long)ng) * SEXT816((long)psVar20),8) - (long)psVar10 !=
      (ulong)((secp256k1_gej *)((long)ng * (long)psVar20) < r_00)) goto LAB_0011e8c6;
  psStack_1b0 = (secp256k1_gej *)0x11e4d3;
  secp256k1_modinv64_update_de_62
            (&local_b8,&local_90,(secp256k1_modinv64_trans2x2 *)(local_108 + 0x30),
             (secp256k1_modinv64_modinfo *)psVar10);
  uVar11 = local_19c;
  psVar28 = (secp256k1_gej *)(local_168 + 0x30);
  psVar17 = (secp256k1_gej *)(ulong)local_19c;
  ng = (secp256k1_gej *)(ulong)local_19c;
  unaff_RBP = &secp256k1_const_modinfo_fe;
  psVar10 = (secp256k1_gej *)0xffffffffffffffff;
  psStack_1b0 = (secp256k1_gej *)0x11e4f7;
  r_00 = psVar28;
  iVar4 = secp256k1_modinv64_mul_cmp_62
                    ((secp256k1_modinv64_signed62 *)psVar28,local_19c,
                     &secp256k1_const_modinfo_fe.modulus,-1);
  psVar26 = local_198;
  psVar18 = (secp256k1_gej *)local_108;
  if (0 < iVar4) {
    psVar10 = (secp256k1_gej *)0x1;
    ng = (secp256k1_gej *)(ulong)uVar11;
    psStack_1b0 = (secp256k1_gej *)0x11e51e;
    r_00 = psVar28;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar28,uVar11,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar4) goto LAB_0011e88f;
    ng = (secp256k1_gej *)(ulong)uVar11;
    psVar10 = (secp256k1_gej *)0xffffffffffffffff;
    psStack_1b0 = (secp256k1_gej *)0x11e53a;
    r_00 = psVar18;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar18,uVar11,
                       &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar4 < 1) goto LAB_0011e894;
    psVar10 = (secp256k1_gej *)0x1;
    ng = (secp256k1_gej *)(ulong)uVar11;
    psStack_1b0 = (secp256k1_gej *)0x11e554;
    r_00 = psVar18;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar18,uVar11,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar4) goto LAB_0011e899;
    psStack_1b0 = (secp256k1_gej *)0x11e571;
    secp256k1_modinv64_update_fg_62_var
              (uVar11,(secp256k1_modinv64_signed62 *)psVar28,(secp256k1_modinv64_signed62 *)psVar18,
               (secp256k1_modinv64_trans2x2 *)(local_108 + 0x30));
    if ((undefined1 *)local_108._0_8_ == (undefined1 *)0x0) {
      if (1 < (int)uVar11) {
        uVar9 = 1;
        uVar12 = 0;
        do {
          uVar12 = uVar12 | *(ulong *)(local_108 + uVar9 * 8);
          uVar9 = uVar9 + 1;
        } while (uVar11 != uVar9);
        if (uVar12 != 0) goto LAB_0011e5a7;
      }
      r_00 = (secp256k1_gej *)local_108;
      ng = (secp256k1_gej *)(ulong)uVar11;
      psVar10 = (secp256k1_gej *)0x0;
      psStack_1b0 = (secp256k1_gej *)0x11e69d;
      iVar4 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)r_00,uVar11,&SECP256K1_SIGNED62_ONE,0);
      if (iVar4 != 0) goto LAB_0011e8b7;
      psStack_1b0 = (secp256k1_gej *)0x11e6bf;
      iVar4 = secp256k1_modinv64_mul_cmp_62
                        ((secp256k1_modinv64_signed62 *)(local_168 + 0x30),uVar11,
                         &SECP256K1_SIGNED62_ONE,-1);
      modinfo = extraout_RDX;
      if (iVar4 != 0) {
        psStack_1b0 = (secp256k1_gej *)0x11e6db;
        iVar4 = secp256k1_modinv64_mul_cmp_62
                          ((secp256k1_modinv64_signed62 *)(local_168 + 0x30),uVar11,
                           &SECP256K1_SIGNED62_ONE,1);
        modinfo = extraout_RDX_00;
        if (iVar4 != 0) {
          r_00 = (secp256k1_gej *)local_168;
          ng = (secp256k1_gej *)0x5;
          psVar10 = (secp256k1_gej *)0x0;
          psStack_1b0 = (secp256k1_gej *)0x11e6f7;
          iVar4 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)r_00,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar4 != 0) goto LAB_0011e8c1;
          r_00 = (secp256k1_gej *)&local_b8;
          ng = (secp256k1_gej *)0x5;
          psVar10 = (secp256k1_gej *)0x0;
          psStack_1b0 = (secp256k1_gej *)0x11e71a;
          iVar4 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)r_00,5,&SECP256K1_SIGNED62_ONE,0);
          if (iVar4 != 0) goto LAB_0011e8c1;
          r_00 = (secp256k1_gej *)(local_168 + 0x30);
          psVar10 = (secp256k1_gej *)0x1;
          ng = (secp256k1_gej *)(ulong)uVar11;
          psStack_1b0 = (secp256k1_gej *)0x11e73a;
          iVar4 = secp256k1_modinv64_mul_cmp_62
                            ((secp256k1_modinv64_signed62 *)r_00,uVar11,
                             &secp256k1_const_modinfo_fe.modulus,1);
          modinfo = extraout_RDX_01;
          if (iVar4 != 0) goto LAB_0011e8c1;
        }
      }
      psStack_1b0 = (secp256k1_gej *)0x11e75a;
      secp256k1_modinv64_normalize_62
                (&local_b8,*(int64_t *)(local_168 + (long)(int)uVar11 * 8 + 0x28),modinfo);
      psVar17 = local_170;
      local_168._32_8_ = local_b8.v[4];
      local_168._16_8_ = local_b8.v[2];
      local_168._24_8_ = local_b8.v[3];
      local_168._0_8_ = local_b8.v[0];
      local_168._8_8_ = local_b8.v[1];
      psStack_1b0 = (secp256k1_gej *)0x11e782;
      secp256k1_fe_from_signed62(&local_170->x,(secp256k1_modinv64_signed62 *)local_168);
      (psVar17->x).magnitude = (uint)(0 < local_190->magnitude);
      (psVar17->x).normalized = 1;
      psStack_1b0 = (secp256k1_gej *)0x11e7a2;
      secp256k1_fe_verify(&psVar17->x);
      uVar9 = (psVar17->x).n[4];
      psVar20 = (secp256k1_gej *)(uVar9 & 0xffffffffffff);
      uVar12 = (uVar9 >> 0x30) * local_188 + (psVar17->x).n[0];
      uVar9 = (uVar12 >> 0x34) + (psVar17->x).n[1];
      uVar13 = (uVar9 >> 0x34) + (psVar17->x).n[2];
      uVar14 = (uVar13 >> 0x34) + (psVar17->x).n[3];
      ng = (secp256k1_gej *)((long)(psVar20->x).n + (uVar14 >> 0x34));
      r_00 = (secp256k1_gej *)
             ((uVar12 ^ 0x1000003d0) & uVar9 & uVar13 & uVar14 & ((ulong)ng ^ 0xf000000000000));
      bVar7 = r_00 == (secp256k1_gej *)0xfffffffffffff ||
              ((uVar9 | uVar12 | uVar13 | uVar14) & 0xfffffffffffff) == 0 &&
              ng == (secp256k1_gej *)0x0;
      psVar10 = (secp256k1_gej *)CONCAT71((int7)(((ulong)ng ^ 0xf000000000000) >> 8),bVar7);
      if ((local_180 != 0xfffffffffffff && local_178 != 0) != bVar7) {
        secp256k1_fe_verify(&psVar17->x);
        return;
      }
      goto LAB_0011e8bc;
    }
LAB_0011e5a7:
    lVar16 = (long)(int)uVar11;
    uVar9 = *(ulong *)(local_168 + lVar16 * 8 + 0x28);
    psVar10 = (secp256k1_gej *)local_118[lVar16 + 1];
    r_00 = (secp256k1_gej *)((long)uVar9 >> 0x3f ^ uVar9 | lVar16 + -2 >> 0x3f);
    ng = (secp256k1_gej *)((long)psVar10 >> 0x3f ^ (ulong)psVar10 | (ulong)r_00);
    if (ng == (secp256k1_gej *)0x0) {
      psVar17 = (secp256k1_gej *)(ulong)(uVar11 - 1);
      *(ulong *)(local_168 + lVar16 * 8 + 0x20) =
           *(ulong *)(local_168 + lVar16 * 8 + 0x20) | uVar9 << 0x3e;
      psVar10 = (secp256k1_gej *)((long)psVar10 << 0x3e);
      local_118[lVar16] = local_118[lVar16] | (ulong)psVar10;
    }
    if ((int)psVar26 == 0xb) goto LAB_0011e89e;
    uVar11 = (uint)psVar17;
    unaff_RBP = &secp256k1_const_modinfo_fe;
    psVar10 = (secp256k1_gej *)0xffffffffffffffff;
    psStack_1b0 = (secp256k1_gej *)0x11e617;
    ng = psVar17;
    r_00 = psVar28;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar28,uVar11,
                       &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar4 < 1) goto LAB_0011e8a3;
    psVar10 = (secp256k1_gej *)0x1;
    psStack_1b0 = (secp256k1_gej *)0x11e631;
    ng = psVar17;
    r_00 = psVar28;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar28,uVar11,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (0 < iVar4) goto LAB_0011e8a8;
    psVar10 = (secp256k1_gej *)0xffffffffffffffff;
    psStack_1b0 = (secp256k1_gej *)0x11e64d;
    ng = psVar17;
    r_00 = psVar18;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar18,uVar11,
                       &secp256k1_const_modinfo_fe.modulus,-1);
    if (iVar4 < 1) goto LAB_0011e8ad;
    psVar10 = (secp256k1_gej *)0x1;
    psStack_1b0 = (secp256k1_gej *)0x11e667;
    ng = psVar17;
    r_00 = psVar18;
    iVar4 = secp256k1_modinv64_mul_cmp_62
                      ((secp256k1_modinv64_signed62 *)psVar18,uVar11,
                       &secp256k1_const_modinfo_fe.modulus,1);
    if (-1 < iVar4) goto LAB_0011e8b2;
    local_198 = (secp256k1_gej *)(ulong)((int)psVar26 + 1);
    local_19c = uVar11;
    goto LAB_0011e2f3;
  }
LAB_0011e88a:
  psStack_1b0 = (secp256k1_gej *)0x11e88f;
  secp256k1_fe_inv_var_cold_21();
LAB_0011e88f:
  psStack_1b0 = (secp256k1_gej *)0x11e894;
  secp256k1_fe_inv_var_cold_20();
LAB_0011e894:
  psStack_1b0 = (secp256k1_gej *)0x11e899;
  secp256k1_fe_inv_var_cold_19();
LAB_0011e899:
  psStack_1b0 = (secp256k1_gej *)0x11e89e;
  secp256k1_fe_inv_var_cold_18();
LAB_0011e89e:
  psStack_1b0 = (secp256k1_gej *)0x11e8a3;
  secp256k1_fe_inv_var_cold_14();
LAB_0011e8a3:
  psStack_1b0 = (secp256k1_gej *)0x11e8a8;
  secp256k1_fe_inv_var_cold_13();
LAB_0011e8a8:
  psStack_1b0 = (secp256k1_gej *)0x11e8ad;
  secp256k1_fe_inv_var_cold_12();
LAB_0011e8ad:
  psStack_1b0 = (secp256k1_gej *)0x11e8b2;
  secp256k1_fe_inv_var_cold_11();
LAB_0011e8b2:
  psStack_1b0 = (secp256k1_gej *)0x11e8b7;
  secp256k1_fe_inv_var_cold_10();
LAB_0011e8b7:
  psStack_1b0 = (secp256k1_gej *)0x11e8bc;
  secp256k1_fe_inv_var_cold_15();
LAB_0011e8bc:
  psStack_1b0 = (secp256k1_gej *)0x11e8c1;
  secp256k1_fe_inv_var_cold_17();
LAB_0011e8c1:
  psStack_1b0 = (secp256k1_gej *)0x11e8c6;
  secp256k1_fe_inv_var_cold_16();
  psStack_1d0 = psVar18;
LAB_0011e8c6:
  psStack_1b0 = (secp256k1_gej *)secp256k1_modinv64_update_fg_62_var;
  secp256k1_fe_inv_var_cold_9();
  iVar4 = (int)r_00;
  psVar18 = (secp256k1_gej *)unaff_RBP;
  psVar5 = psStack_1d0;
  psStack_1d8 = psVar17;
  psStack_1c8 = psVar26;
  psStack_1c0 = psVar27;
  psStack_1b8 = psVar28;
  psStack_1b0 = (secp256k1_gej *)unaff_RBP;
  if (iVar4 < 1) {
LAB_0011eb73:
    psStack_208 = (secp256k1_gej *)0x11eb78;
    secp256k1_modinv64_update_fg_62_var_cold_9();
LAB_0011eb78:
    psStack_208 = (secp256k1_gej *)0x11eb7d;
    secp256k1_modinv64_update_fg_62_var_cold_1();
    psVar25 = psVar27;
LAB_0011eb7d:
    psStack_208 = (secp256k1_gej *)0x11eb82;
    secp256k1_modinv64_update_fg_62_var_cold_2();
LAB_0011eb82:
    psStack_208 = (secp256k1_gej *)0x11eb87;
    secp256k1_modinv64_update_fg_62_var_cold_6();
LAB_0011eb87:
    psStack_208 = (secp256k1_gej *)0x11eb8c;
    secp256k1_modinv64_update_fg_62_var_cold_5();
    psVar27 = psVar25;
    psVar23 = psVar28;
  }
  else {
    uStack_1e0 = (psVar10->x).n[0];
    uStack_1e8 = (psVar10->x).n[1];
    uVar1 = (ng->x).n[0];
    psVar20 = (secp256k1_gej *)(extraout_RDX_02->x).n[0];
    psVar27 = (secp256k1_gej *)(uVar1 * uStack_1e0);
    lVar15 = SUB168(SEXT816((long)uVar1) * SEXT816((long)uStack_1e0),8);
    uVar12 = (long)psVar20 * uStack_1e8;
    psVar17 = SUB168(SEXT816((long)psVar20) * SEXT816((long)uStack_1e8),8);
    psVar26 = (secp256k1_gej *)0x7fffffffffffffff;
    uVar9 = (ulong)((secp256k1_gej *)~uVar12 < psVar27);
    lVar16 = (0x7fffffffffffffff - (long)psVar17) - lVar15;
    psVar5 = extraout_RDX_02;
    psVar23 = (secp256k1_gej *)~uVar12;
    if ((SBORROW8(0x7fffffffffffffff - (long)psVar17,lVar15) != SBORROW8(lVar16,uVar9)) ==
        (long)(lVar16 - uVar9) < 0 || (long)psVar17 < 0) {
      uStack_1f0 = (psVar10->x).n[2];
      psVar23 = (secp256k1_gej *)(psVar10->x).n[3];
      puVar21 = (uint64_t *)((long)(psVar27->x).n + uVar12);
      psVar17 = (secp256k1_gej *)
                ((long)(psVar17->x).n + (ulong)CARRY8(uVar12,(ulong)psVar27) + lVar15);
      uVar12 = uVar1 * uStack_1f0;
      psVar27 = SUB168(SEXT816((long)uVar1) * SEXT816((long)uStack_1f0),8);
      auVar3 = SEXT816((long)psVar20);
      psVar20 = (secp256k1_gej *)((long)psVar20 * (long)psVar23);
      lVar15 = SUB168(auVar3 * SEXT816((long)psVar23),8);
      uVar9 = (ulong)(-(long)psVar20 - 1U < uVar12);
      lVar16 = (0x7fffffffffffffff - lVar15) - (long)psVar27;
      bVar7 = (SBORROW8(0x7fffffffffffffff - lVar15,(long)psVar27) != SBORROW8(lVar16,uVar9)) !=
              (long)(lVar16 - uVar9) < 0 && -1 < lVar15;
      psVar10 = (secp256k1_gej *)CONCAT71((int7)(-(long)psVar20 - 1U >> 8),bVar7);
      psStack_1f8 = psVar23;
      if (bVar7) goto LAB_0011eb91;
      bVar7 = CARRY8((ulong)psVar20,uVar12);
      psVar20 = (secp256k1_gej *)((long)(psVar20->x).n + uVar12);
      lVar16 = (long)(psVar27->x).n + (ulong)bVar7 + lVar15;
      psVar28 = psVar23;
      if (((ulong)puVar21 & 0x3fffffffffffffff) != 0) goto LAB_0011eb78;
      psVar25 = psVar27;
      if (((ulong)psVar20 & 0x3fffffffffffffff) != 0) goto LAB_0011eb7d;
      psVar20 = (secp256k1_gej *)((ulong)psVar20 >> 0x3e | lVar16 * 4);
      uVar9 = (ulong)puVar21 >> 0x3e | (long)psVar17 * 4;
      psVar25 = (secp256k1_gej *)(lVar16 >> 0x3e);
      psVar17 = (secp256k1_gej *)((long)psVar17 >> 0x3e);
      iStack_1fc = iVar4;
      if (iVar4 != 1) {
        psVar18 = (secp256k1_gej *)0x3fffffffffffffff;
        r_00 = (secp256k1_gej *)((ulong)r_00 & 0xffffffff);
        psVar10 = (secp256k1_gej *)0x1;
        do {
          psVar27 = (secp256k1_gej *)(ng->x).n[(long)psVar10];
          psVar28 = (secp256k1_gej *)((long)psVar27 * uStack_1e0 + uVar9);
          puVar24 = (undefined1 *)
                    ((long)(psVar17->x).n +
                    (ulong)CARRY8((long)psVar27 * uStack_1e0,uVar9) +
                    SUB168(SEXT816((long)psVar27) * SEXT816((long)uStack_1e0),8));
          uVar1 = (extraout_RDX_02->x).n[(long)psVar10];
          uVar9 = uVar1 * uStack_1e8;
          lVar16 = SUB168(SEXT816((long)uVar1) * SEXT816((long)uStack_1e8),8);
          if (lVar16 < 0) {
            psVar26 = (secp256k1_gej *)((-0x8000000000000000 - lVar16) - (ulong)(uVar9 != 0));
            psVar17 = (secp256k1_gej *)
                      (((long)puVar24 - (long)psVar26) - (ulong)(psVar28 < (secp256k1_gej *)-uVar9))
            ;
            if ((SBORROW8((long)puVar24,(long)psVar26) !=
                SBORROW8((long)puVar24 - (long)psVar26,(ulong)(psVar28 < (secp256k1_gej *)-uVar9)))
                == (long)psVar17 < 0) goto LAB_0011ea62;
LAB_0011eb69:
            psStack_208 = (secp256k1_gej *)0x11eb6e;
            secp256k1_modinv64_update_fg_62_var_cold_4();
LAB_0011eb6e:
            psStack_208 = (secp256k1_gej *)0x11eb73;
            secp256k1_modinv64_update_fg_62_var_cold_3();
            goto LAB_0011eb73;
          }
          psVar17 = (secp256k1_gej *)(-1 - uVar9);
          lVar15 = (0x7fffffffffffffff - lVar16) - (long)puVar24;
          psVar26 = (secp256k1_gej *)(lVar15 - (ulong)(psVar17 < psVar28));
          if ((SBORROW8(0x7fffffffffffffff - lVar16,(long)puVar24) !=
              SBORROW8(lVar15,(ulong)(psVar17 < psVar28))) != (long)psVar26 < 0) goto LAB_0011eb69;
LAB_0011ea62:
          bVar7 = CARRY8((ulong)psVar28,uVar9);
          psVar28 = (secp256k1_gej *)((long)(psVar28->x).n + uVar9);
          psVar17 = (secp256k1_gej *)((long)(psVar20->x).n + (long)psVar27 * uStack_1f0);
          psVar27 = (secp256k1_gej *)
                    ((long)(psVar25->x).n +
                    (ulong)CARRY8((long)psVar27 * uStack_1f0,(ulong)psVar20) +
                    SUB168(SEXT816((long)psVar27) * SEXT816((long)uStack_1f0),8));
          uVar9 = uVar1 * (long)psVar23;
          lVar15 = SUB168(SEXT816((long)uVar1) * SEXT816((long)psVar23),8);
          if (lVar15 < 0) {
            lVar22 = (-0x8000000000000000 - lVar15) - (ulong)(uVar9 != 0);
            lVar2 = (long)psVar27 - lVar22;
            psVar20 = (secp256k1_gej *)(lVar2 - (ulong)(psVar17 < (secp256k1_gej *)-uVar9));
            psVar26 = (secp256k1_gej *)0x7fffffffffffffff;
            if ((SBORROW8((long)psVar27,lVar22) !=
                SBORROW8(lVar2,(ulong)(psVar17 < (secp256k1_gej *)-uVar9))) != (long)psVar20 < 0)
            goto LAB_0011eb6e;
          }
          else {
            psVar20 = (secp256k1_gej *)(-1 - uVar9);
            psVar26 = (secp256k1_gej *)0x7fffffffffffffff;
            lVar2 = (0x7fffffffffffffff - lVar15) - (long)psVar27;
            if ((SBORROW8(0x7fffffffffffffff - lVar15,(long)psVar27) !=
                SBORROW8(lVar2,(ulong)(psVar20 < psVar17))) !=
                (long)(lVar2 - (ulong)(psVar20 < psVar17)) < 0) goto LAB_0011eb6e;
          }
          puVar21 = (uint64_t *)((long)(psVar17->x).n + uVar9);
          lVar15 = (long)(psVar27->x).n + (ulong)CARRY8((ulong)psVar17,uVar9) + lVar15;
          uVar9 = (long)(puVar24 + (ulong)bVar7 + lVar16) * 4 | (ulong)psVar28 >> 0x3e;
          (ng->x).n[(long)&psVar10[-1].field_0x97] = (uint64_t)((ulong)psVar28 & 0x3fffffffffffffff)
          ;
          psVar20 = (secp256k1_gej *)(lVar15 * 4 | (ulong)puVar21 >> 0x3e);
          (extraout_RDX_02->x).n[(long)&psVar10[-1].field_0x97] =
               (ulong)puVar21 & 0x3fffffffffffffff;
          psVar10 = (secp256k1_gej *)((long)(psVar10->x).n + 1);
          psVar25 = (secp256k1_gej *)(lVar15 >> 0x3e);
          psVar17 = (secp256k1_gej *)((long)(puVar24 + (ulong)bVar7 + lVar16) >> 0x3e);
          psVar28 = (secp256k1_gej *)((ulong)psVar28 & 0x3fffffffffffffff);
        } while (r_00 != psVar10);
      }
      psVar26 = (secp256k1_gej *)0x7fffffffffffffff;
      if ((undefined1 *)((long)(psVar17->x).n + ((ulong)(0x7fffffffffffffff < uVar9) - 1)) !=
          (undefined1 *)0xffffffffffffffff) goto LAB_0011eb82;
      psVar10 = (secp256k1_gej *)0xffffffffffffffff;
      (ng->x).n[(long)iVar4 + -1] = uVar9;
      psVar25 = (secp256k1_gej *)
                ((long)(psVar25->x).n + ((ulong)((secp256k1_gej *)0x7fffffffffffffff < psVar20) - 1)
                );
      if (psVar25 == (secp256k1_gej *)0xffffffffffffffff) {
        (extraout_RDX_02->x).n[(long)iVar4 + -1] = (uint64_t)psVar20;
        return;
      }
      goto LAB_0011eb87;
    }
  }
  psStack_208 = (secp256k1_gej *)0x11eb91;
  secp256k1_modinv64_update_fg_62_var_cold_8();
LAB_0011eb91:
  psStack_208 = (secp256k1_gej *)secp256k1_ecmult_multi_simple_var;
  secp256k1_modinv64_update_fg_62_var_cold_7();
  psStack_230 = psVar17;
  psStack_228 = psVar5;
  psStack_220 = psVar26;
  psStack_218 = psVar27;
  psStack_210 = psVar23;
  psStack_208 = psVar18;
  secp256k1_gej_set_infinity(r_00);
  secp256k1_gej_set_infinity(&sStack_9b0);
  sStack_a48.x.n[0] = (uint64_t)asStack_918;
  sStack_a48.x.n[1] = (uint64_t)asStack_7e8;
  sStack_a48.x.n[2] = (uint64_t)&sStack_648;
  secp256k1_ecmult_strauss_wnaf
            ((secp256k1_strauss_state *)&sStack_a48,r_00,1,&sStack_9b0,&secp256k1_scalar_zero,
             (secp256k1_scalar *)ng);
  if (psVar20 != (secp256k1_gej *)0x0) {
    psVar28 = (secp256k1_gej *)0x0;
    do {
      iVar4 = (*extraout_RDX_03)(&sStack_a64,&sStack_850,psVar28,psVar10);
      if (iVar4 == 0) {
        return;
      }
      secp256k1_gej_set_ge(&sStack_a48,&sStack_850);
      sStack_a60.aux = asStack_918;
      sStack_a60.pre_a = asStack_7e8;
      sStack_a60.ps = &sStack_648;
      psVar17 = &sStack_a48;
      secp256k1_ecmult_strauss_wnaf
                (&sStack_a60,&sStack_9b0,1,&sStack_a48,&sStack_a64,(secp256k1_scalar *)0x0);
      secp256k1_gej_add_var(r_00,r_00,&sStack_9b0,&psVar17->x);
      psVar28 = (secp256k1_gej *)((long)(psVar28->x).n + 1);
    } while (psVar20 != psVar28);
  }
  return;
}

Assistant:

SECP256K1_INLINE static void secp256k1_fe_inv_var(secp256k1_fe *r, const secp256k1_fe *x) {
    int input_is_zero = secp256k1_fe_normalizes_to_zero(x);
    SECP256K1_FE_VERIFY(x);

    secp256k1_fe_impl_inv_var(r, x);
    r->magnitude = x->magnitude > 0;
    r->normalized = 1;

    VERIFY_CHECK(secp256k1_fe_normalizes_to_zero(r) == input_is_zero);
    SECP256K1_FE_VERIFY(r);
}